

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_YAFluxRegister.cpp
# Opt level: O0

void __thiscall
amrex::YAFluxRegister::FineAdd
          (YAFluxRegister *this,MFIter *mfi,array<const_amrex::FArrayBox_*,_3UL> *a_flux,Real *dx,
          Real dt,RunOn runon)

{
  uint uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  BaseFab<double> *this_00;
  const_reference ppFVar5;
  reference pvVar6;
  IntVect *pIVar7;
  reference ppFVar8;
  reference ppFVar9;
  reference pvVar10;
  double *in_RCX;
  long lVar11;
  long in_RDI;
  int in_R8D;
  double in_XMM0_Qa;
  IntVect IVar12;
  Box tmpbox_1;
  Array4<const_double> farr_1;
  int dirside_1;
  Real dtdxs_1;
  Array4<double> d_1;
  int side_1;
  Box *hibx_is;
  Box tmpbox;
  Array4<const_double> farr;
  int dirside;
  Real dtdxs;
  Array4<double> d;
  int side;
  Box *lobx_is;
  FArrayBox *cfp;
  iterator __end2;
  iterator __begin2;
  Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_> *__range2;
  FArrayBox *f;
  Box *hibx;
  Box *lobx;
  int idim_1;
  Box bx_1;
  Box *b;
  int idim;
  array<amrex::FArrayBox,_3UL> ftmp;
  bool use_gpu;
  array<const_amrex::FArrayBox_*,_3UL> flux;
  Dim3 rr;
  array<double,_3UL> dtdx;
  Real ratio;
  int nc;
  Box result_1;
  Box *fbx;
  Box result;
  Box *bx;
  Box *tbx;
  Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_> *cfp_fabs;
  int li;
  IndexType typ;
  int sm;
  IntVect hi;
  IntVect low;
  IndexType typ_1;
  int bg;
  uint bitval;
  IntVect hi_1;
  IntVect low_1;
  Real tmp_11;
  int ii_11;
  int ioff_7;
  int jj_11;
  int joff_7;
  Real *dp_11;
  int kk_11;
  int k_11;
  int i_11;
  int j_11;
  int n_11;
  Real tmp_10;
  int ii_10;
  int ioff_6;
  int jj_10;
  int joff_6;
  Real *dp_10;
  int kk_10;
  int k_10;
  int i_10;
  int j_10;
  int n_10;
  Real tmp_9;
  int ii_9;
  int ioff_5;
  int kk_9;
  int koff_7;
  Real *dp_9;
  int jj_9;
  int j_9;
  int i_9;
  int k_9;
  int n_9;
  Real tmp_8;
  int ii_8;
  int ioff_4;
  int kk_8;
  int koff_6;
  Real *dp_8;
  int jj_8;
  int j_8;
  int i_8;
  int k_8;
  int n_8;
  Real tmp_7;
  int jj_7;
  int joff_5;
  int kk_7;
  int koff_5;
  Real *dp_7;
  int ii_7;
  int i_7;
  int j_7;
  int k_7;
  int n_7;
  Real tmp_6;
  int jj_6;
  int joff_4;
  int kk_6;
  int koff_4;
  Real *dp_6;
  int ii_6;
  int i_6;
  int j_6;
  int k_6;
  int n_6;
  Dim3 hi_3;
  Dim3 lo_1;
  Real tmp_5;
  int ii_5;
  int ioff_3;
  int jj_5;
  int joff_3;
  Real *dp_5;
  int kk_5;
  int k_5;
  int i_5;
  int j_5;
  int n_5;
  Real tmp_4;
  int ii_4;
  int ioff_2;
  int jj_4;
  int joff_2;
  Real *dp_4;
  int kk_4;
  int k_4;
  int i_4;
  int j_4;
  int n_4;
  Real tmp_3;
  int ii_3;
  int ioff_1;
  int kk_3;
  int koff_3;
  Real *dp_3;
  int jj_3;
  int j_3;
  int i_3;
  int k_3;
  int n_3;
  Real tmp_2;
  int ii_2;
  int ioff;
  int kk_2;
  int koff_2;
  Real *dp_2;
  int jj_2;
  int j_2;
  int i_2;
  int k_2;
  int n_2;
  Real tmp_1;
  int jj_1;
  int joff_1;
  int kk_1;
  int koff_1;
  Real *dp_1;
  int ii_1;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Real tmp;
  int jj;
  int joff;
  int kk;
  int koff;
  Real *dp;
  int ii;
  int i;
  int j;
  int k;
  int n;
  Dim3 hi_2;
  Dim3 lo;
  int dir;
  IntVect off;
  IntVect shft;
  Box *in_stack_ffffffffffffe958;
  MFIter *in_stack_ffffffffffffe960;
  Box *in_stack_ffffffffffffe968;
  array<amrex::FArrayBox,_3UL> *in_stack_ffffffffffffe970;
  Box *in_stack_ffffffffffffe978;
  BaseFab<double> *in_stack_ffffffffffffe980;
  bool local_1649;
  BaseFab<double> *src;
  BaseFab<double> *pBVar13;
  MFIter *in_stack_ffffffffffffe9c0;
  int local_1634;
  int local_1630;
  int local_162c;
  int local_1624;
  int local_1620;
  int local_161c;
  int local_1614;
  int local_1610;
  int local_160c;
  int local_15fc;
  int local_15f8;
  int local_15f4;
  int local_15ec;
  int local_15e8;
  int local_15e4;
  int local_15dc;
  int local_15d8;
  int local_15d4;
  uint local_15c4;
  uint local_15c0;
  uint local_15bc;
  int local_15b4;
  int local_15b0;
  int local_15ac;
  int local_15a4;
  int local_15a0;
  int local_159c;
  undefined8 local_1568;
  int iStack_1560;
  int local_155c;
  int iStack_1558;
  undefined8 uStack_1554;
  Array4<const_double> local_1540;
  uint local_14fc;
  double local_14f8;
  Array4<double> local_14f0;
  undefined4 local_14b0;
  Box local_14ac;
  Box *local_1490;
  undefined8 local_1488;
  int iStack_1480;
  int local_147c;
  int iStack_1478;
  undefined8 uStack_1474;
  Array4<const_double> local_1460;
  uint local_141c;
  double local_1418;
  Array4<double> local_1410;
  undefined4 local_13d0;
  Box local_13cc;
  Box *local_13b0;
  BaseFab<double> *local_13a8;
  FArrayBox **local_13a0;
  __normal_iterator<amrex::FArrayBox_**,_std::vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>
  local_1398;
  Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_> *local_1390;
  value_type local_1388;
  Box local_137c;
  Box *local_1360;
  Box local_1354;
  Box *local_1338;
  uint local_132c;
  undefined8 local_1328;
  undefined8 local_131c;
  undefined8 local_1314;
  undefined8 local_130c;
  uint local_1304;
  undefined8 *local_1300;
  int local_12f4;
  bool local_1211;
  value_type local_1210;
  value_type local_1208;
  value_type local_1200;
  undefined8 local_11f8;
  int local_11f0;
  undefined8 local_11e4;
  int local_11dc;
  double local_11d8;
  double local_11d0;
  double local_11c8;
  double local_11c0;
  int local_11b8;
  undefined1 local_11b4 [40];
  Box local_118c;
  Box *local_1170;
  long local_1164;
  long local_115c;
  long local_1154;
  uint local_114c;
  long *local_1148;
  Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_> *local_1140;
  int local_1138;
  int local_1134;
  double local_1130;
  double *local_1128;
  value_type local_1108;
  value_type local_1100;
  int *local_10f8;
  int *local_10f0;
  int *local_10e8;
  long *local_10e0;
  BaseFab<double> *local_10d8;
  Box *local_10d0;
  undefined4 local_10c4;
  int *local_10c0;
  undefined4 local_10b4;
  int *local_10b0;
  undefined4 local_10a4;
  int *local_10a0;
  undefined8 local_1098;
  int local_1090;
  int *local_1088;
  int local_107c;
  undefined4 uStack_1078;
  int local_1074;
  bool *local_1070;
  int local_1064;
  undefined8 *local_1060;
  uint local_1054;
  uint local_1050;
  int local_104c;
  IntVect local_1048;
  IntVect local_1038;
  int local_1028;
  uint local_1024;
  Box *local_1020;
  uint local_1014;
  IntVect *local_1010;
  uint local_1004;
  uint local_1000;
  int local_ffc;
  int local_ff8 [3];
  undefined8 local_fe8;
  int local_fe0;
  uint local_fdc;
  IntVect local_fd8;
  IntVect local_fc8;
  int local_fb8;
  uint local_fb4;
  Box *local_fb0;
  uint local_fa4;
  IntVect *local_fa0;
  uint local_f94;
  undefined8 *local_f90;
  BaseFab<double> *local_f88;
  BaseFab<double> *local_f80;
  double local_f78;
  int local_f70;
  int local_f6c;
  int local_f68;
  int local_f64;
  double *local_f60;
  int local_f54;
  int local_f50;
  int local_f4c;
  int local_f48;
  int local_f44;
  double local_f40;
  int local_f38;
  int local_f34;
  int local_f30;
  int local_f2c;
  double *local_f28;
  int local_f1c;
  int local_f18;
  int local_f14;
  int local_f10;
  int local_f0c;
  double local_f08;
  int local_f00;
  int local_efc;
  int local_ef8;
  int local_ef4;
  double *local_ef0;
  int local_ee4;
  int local_ee0;
  int local_edc;
  int local_ed8;
  int local_ed4;
  double local_ed0;
  int local_ec8;
  int local_ec4;
  int local_ec0;
  int local_ebc;
  double *local_eb8;
  int local_eac;
  int local_ea8;
  int local_ea4;
  int local_ea0;
  int local_e9c;
  double local_e98;
  int local_e90;
  int local_e8c;
  int local_e88;
  int local_e84;
  double *local_e80;
  int local_e74;
  int local_e70;
  int local_e6c;
  int local_e68;
  int local_e64;
  double local_e60;
  int local_e58;
  int local_e54;
  int local_e50;
  int local_e4c;
  double *local_e48;
  int local_e3c;
  int local_e38;
  int local_e34;
  int local_e30;
  int local_e2c;
  undefined8 local_e28;
  int local_e20;
  undefined8 local_e18;
  int local_e10;
  undefined8 local_e08;
  int local_e00;
  undefined8 local_df8;
  int local_df0;
  undefined8 *local_de8;
  uint local_de0;
  int local_ddc;
  double local_dd8;
  Array4<const_double> *local_dd0;
  Array4<double> *local_dc8;
  undefined8 *local_dc0;
  double local_db8;
  int local_db0;
  int local_dac;
  int local_da8;
  int local_da4;
  double *local_da0;
  int local_d94;
  int local_d90;
  int local_d8c;
  int local_d88;
  int local_d84;
  double local_d80;
  int local_d78;
  int local_d74;
  int local_d70;
  int local_d6c;
  double *local_d68;
  int local_d5c;
  int local_d58;
  int local_d54;
  int local_d50;
  int local_d4c;
  double local_d10;
  int local_d08;
  int local_d04;
  int local_d00;
  int local_cfc;
  double *local_cf8;
  int local_cec;
  int local_ce8;
  int local_ce4;
  int local_ce0;
  int local_cdc;
  double local_ca0;
  int local_c98;
  int local_c94;
  int local_c90;
  int local_c8c;
  double *local_c88;
  int local_c7c;
  int local_c78;
  int local_c74;
  int local_c70;
  int local_c6c;
  undefined8 local_c68;
  int local_c60;
  undefined8 local_c58;
  int local_c50;
  undefined8 local_c48;
  int local_c40;
  undefined8 local_c38;
  int local_c30;
  undefined8 *local_c28;
  uint local_c20;
  int local_c1c;
  double local_c18;
  Array4<const_double> *local_c10;
  Array4<double> *local_c08;
  undefined8 *local_c00;
  undefined8 local_bf8;
  int local_bf0;
  undefined8 *local_be8;
  int local_bdc;
  int iStack_bd8;
  int local_bd4;
  undefined8 local_bd0;
  int local_bc8;
  undefined8 *local_bc0;
  int local_bb4;
  int iStack_bb0;
  int local_bac;
  undefined8 local_ba8;
  int local_ba0;
  undefined8 *local_b98;
  int local_b8c;
  int iStack_b88;
  int local_b84;
  undefined8 local_b80;
  int local_b78;
  undefined8 *local_b70;
  int local_b64;
  int iStack_b60;
  int local_b5c;
  int local_b58;
  int local_b54;
  int local_b50;
  int local_b4c;
  Array4<double> *local_b48;
  int local_b40;
  int local_b3c;
  int local_b38;
  int local_b34;
  Array4<double> *local_b30;
  int local_b10;
  int local_b0c;
  int local_b08;
  int local_b04;
  Array4<double> *local_b00;
  int local_ae0;
  int local_adc;
  int local_ad8;
  int local_ad4;
  Array4<double> *local_ad0;
  int local_ac8;
  int local_ac4;
  int local_ac0;
  int local_abc;
  Array4<double> *local_ab8;
  int local_ab0;
  int local_aac;
  int local_aa8;
  int local_aa4;
  Array4<double> *local_aa0;
  int local_a98;
  int local_a94;
  int local_a90;
  int local_a8c;
  Array4<double> *local_a88;
  int local_a80;
  int local_a7c;
  int local_a78;
  int local_a74;
  Array4<double> *local_a70;
  int local_a68;
  int local_a64;
  int local_a60;
  int local_a5c;
  Array4<double> *local_a58;
  int local_a50;
  int local_a4c;
  int local_a48;
  int local_a44;
  Array4<double> *local_a40;
  undefined4 local_a34;
  int *local_a30;
  undefined4 local_a24;
  int *local_a20;
  undefined4 local_a14;
  int *local_a10;
  undefined4 local_a04;
  int *local_a00;
  undefined4 local_9f4;
  int *local_9f0;
  undefined4 local_9e4;
  int *local_9e0;
  undefined4 local_9d4;
  undefined8 *local_9d0;
  undefined4 local_9c4;
  undefined8 *local_9c0;
  undefined4 local_9b4;
  undefined8 *local_9b0;
  undefined4 local_9a4;
  undefined8 *local_9a0;
  undefined4 local_994;
  undefined8 *local_990;
  undefined4 local_984;
  undefined8 *local_980;
  uint local_974;
  uint *local_970;
  uint local_968;
  uint local_964;
  uint *local_960;
  uint local_954;
  int local_950;
  int local_94c;
  int local_948;
  int local_944;
  Array4<const_double> *local_940;
  int local_938;
  int local_934;
  int local_930;
  int local_92c;
  Array4<const_double> *local_928;
  int local_908;
  int local_904;
  int local_900;
  int local_8fc;
  Array4<const_double> *local_8f8;
  int local_8d8;
  int local_8d4;
  int local_8d0;
  int local_8cc;
  Array4<const_double> *local_8c8;
  int local_8c0;
  int local_8bc;
  int local_8b8;
  int local_8b4;
  Array4<const_double> *local_8b0;
  int local_8a8;
  int local_8a4;
  int local_8a0;
  int local_89c;
  Array4<const_double> *local_898;
  int local_890;
  int local_88c;
  int local_888;
  int local_884;
  Array4<const_double> *local_880;
  int local_878;
  int local_874;
  int local_870;
  int local_86c;
  Array4<const_double> *local_868;
  int local_860;
  int local_85c;
  int local_858;
  int local_854;
  Array4<const_double> *local_850;
  int local_848;
  int local_844;
  int local_840;
  int local_83c;
  Array4<const_double> *local_838;
  int local_830;
  IntVect local_82c;
  int *local_820;
  Box *local_818;
  int local_80c;
  IntVect *local_808;
  int local_7fc;
  int *local_7f8;
  int local_7ec;
  IndexType *local_7e8;
  int local_7dc;
  IndexType *local_7d8;
  int local_7cc;
  IntVect *local_7c8;
  IntVect *local_7c0;
  undefined4 local_7b4;
  IntVect *local_7b0;
  undefined4 local_7a4;
  IntVect *local_7a0;
  undefined4 local_794;
  IntVect *local_790;
  int *local_788;
  IntVect *local_780;
  int *local_778;
  IntVect *local_770;
  int *local_768;
  Box *local_760;
  int local_758;
  uint local_754;
  uint local_750;
  int local_74c;
  int local_748;
  int local_744;
  int local_740;
  int local_73c;
  int local_738;
  int local_734;
  int local_730;
  int local_72c;
  int local_728;
  int local_724;
  int local_720;
  int local_71c;
  int local_718;
  int local_714;
  int local_710;
  int local_70c;
  int local_708;
  int local_704;
  int local_700;
  int local_6fc;
  int local_6f8;
  int local_6f4;
  int local_6f0;
  undefined4 local_6ec;
  int *local_6e8;
  IndexType *local_6e0;
  undefined4 local_6d8;
  int local_6d4;
  IntVect *local_6d0;
  int local_6c8;
  uint local_6c4;
  IntVect *local_6c0;
  int local_6b8;
  uint local_6b4;
  IntVect *local_6b0;
  int local_6a8;
  uint local_6a4;
  IntVect *local_6a0;
  int local_698;
  uint local_694;
  IntVect *local_690;
  int local_688 [2];
  int local_680;
  int local_678;
  int iStack_674;
  int local_670;
  IntVect local_66c;
  BaseFab<double> *local_660;
  BaseFab<double> *local_658;
  IntVect *local_650;
  int *local_648;
  undefined4 local_63c;
  IntVect *local_638;
  undefined4 local_62c;
  IntVect *local_628;
  undefined4 local_61c;
  IntVect *local_618;
  IntVect *local_610;
  int *local_608;
  undefined4 local_5fc;
  IntVect *local_5f8;
  undefined4 local_5ec;
  IntVect *local_5e8;
  undefined4 local_5dc;
  IntVect *local_5d8;
  int *local_5d0;
  IntVect *local_5c8;
  undefined4 local_5bc;
  int *local_5b8;
  undefined4 local_5ac;
  int *local_5a8;
  undefined4 local_59c;
  int *local_598;
  undefined4 local_58c;
  BaseFab<double> *local_588;
  int local_580 [2];
  int local_578;
  Box *local_570;
  IntVect local_564;
  BaseFab<double> *local_558;
  int *local_550;
  undefined4 local_544;
  BaseFab<double> *local_540;
  undefined4 local_534;
  BaseFab<double> *local_530;
  undefined4 local_524;
  BaseFab<double> *local_520;
  BaseFab<double> *local_518;
  BaseFab<double> *local_510;
  undefined4 local_504;
  BaseFab<double> *local_500;
  undefined4 local_4f4;
  BaseFab<double> *local_4f0;
  undefined4 local_4e4;
  BaseFab<double> *local_4e0;
  int local_4d4;
  undefined8 *local_4d0;
  undefined4 local_4c8;
  int local_4c4;
  long local_4c0;
  int local_4b4;
  uint *local_4b0;
  int local_4a4;
  uint *local_4a0;
  int local_498;
  int local_494;
  uint *local_490;
  int local_484;
  double local_480;
  double *local_478;
  double local_470;
  double *local_468;
  double local_450;
  double *local_448;
  double local_430;
  double *local_428;
  double local_420;
  double *local_418;
  double local_410;
  double *local_408;
  double local_400;
  double *local_3f8;
  double local_3f0;
  double *local_3e8;
  double local_3e0;
  double *local_3d8;
  double local_3d0;
  double *local_3c8;
  Dim3 local_3c0;
  Dim3 local_3ac;
  Dim3 local_3a0;
  Dim3 local_390;
  int local_384;
  Box *local_380;
  double *local_378;
  Dim3 local_370;
  Box *local_360;
  int local_358;
  int iStack_354;
  int local_350;
  undefined4 local_34c;
  Box *local_348;
  undefined4 local_33c;
  Box *local_338;
  undefined4 local_32c;
  Box *local_328;
  Dim3 local_320;
  Box *local_310;
  int local_308;
  int iStack_304;
  int local_300;
  undefined4 local_2fc;
  IntVect *local_2f8;
  undefined4 local_2ec;
  IntVect *local_2e8;
  undefined4 local_2dc;
  IntVect *local_2d8;
  Dim3 local_2d0;
  Dim3 local_2bc;
  Dim3 local_2b0;
  Dim3 local_2a0;
  int local_294;
  Box *local_290;
  double *local_288;
  Dim3 local_280;
  Box *local_270;
  int local_268;
  int iStack_264;
  int local_260;
  undefined4 local_25c;
  Box *local_258;
  undefined4 local_24c;
  Box *local_248;
  undefined4 local_23c;
  Box *local_238;
  Dim3 local_230;
  Box *local_220;
  int local_218;
  int iStack_214;
  int local_210;
  undefined4 local_20c;
  IntVect *local_208;
  undefined4 local_1fc;
  IntVect *local_1f8;
  undefined4 local_1ec;
  IntVect *local_1e8;
  Dim3 local_1e0;
  Dim3 local_1d0;
  Dim3 local_1c0;
  Dim3 local_1b0;
  int local_1a4;
  Box *local_1a0;
  double *local_198;
  Dim3 local_190;
  Box *local_180;
  int local_178;
  int iStack_174;
  int local_170;
  undefined4 local_16c;
  Box *local_168;
  undefined4 local_15c;
  Box *local_158;
  undefined4 local_14c;
  Box *local_148;
  Dim3 local_140;
  Box *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  IntVect *local_118;
  undefined4 local_10c;
  IntVect *local_108;
  undefined4 local_fc;
  IntVect *local_f8;
  Dim3 local_f0;
  Dim3 local_e0;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  Box *local_b0;
  double *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_1134 = in_R8D;
  local_1130 = in_XMM0_Qa;
  local_1128 = in_RCX;
  local_1138 = MFIter::LocalIndex(in_stack_ffffffffffffe960);
  local_1140 = Vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
               ::operator[]((Vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
                             *)in_stack_ffffffffffffe960,(size_type)in_stack_ffffffffffffe958);
  bVar3 = std::vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>::empty
                    ((vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_> *)
                     in_stack_ffffffffffffe970);
  if (!bVar3) {
    MFIter::tilebox(in_stack_ffffffffffffe9c0);
    local_1148 = &local_1164;
    local_10e8 = (int *)(in_RDI + 0x7d8);
    local_118c.bigend.vect[0] = (int)((ulong)local_115c >> 0x20);
    local_118c.bigend.vect._4_8_ = local_1154;
    local_118c.btype.itype = local_114c;
    local_818 = &local_118c;
    local_6ec = 1;
    bVar3 = true;
    if ((*local_10e8 == 1) && (bVar3 = true, *(int *)(in_RDI + 0x7dc) == 1)) {
      bVar3 = *(int *)(in_RDI + 0x7e0) != 1;
    }
    local_10e0 = local_1148;
    local_820 = local_10e8;
    local_6e8 = local_10e8;
    if (bVar3) {
      local_118c.smallend.vect[0] = (int)local_1164;
      local_73c = local_118c.smallend.vect[0];
      local_740 = *local_10e8;
      local_738 = local_73c;
      if (local_740 != 1) {
        if (local_740 == 2) {
          if (local_118c.smallend.vect[0] < 0) {
            local_118c.smallend.vect[0] = local_118c.smallend.vect[0] + 1;
            if (local_118c.smallend.vect[0] < 1) {
              local_118c.smallend.vect[0] = -local_118c.smallend.vect[0];
            }
            local_159c = -local_118c.smallend.vect[0] / 2 + -1;
          }
          else {
            local_159c = local_118c.smallend.vect[0] / 2;
          }
          local_738 = local_159c;
        }
        else if (local_740 == 4) {
          if (local_118c.smallend.vect[0] < 0) {
            local_118c.smallend.vect[0] = local_118c.smallend.vect[0] + 1;
            if (local_118c.smallend.vect[0] < 1) {
              local_118c.smallend.vect[0] = -local_118c.smallend.vect[0];
            }
            local_15a0 = -local_118c.smallend.vect[0] / 4 + -1;
          }
          else {
            local_15a0 = local_118c.smallend.vect[0] / 4;
          }
          local_738 = local_15a0;
        }
        else {
          if (local_118c.smallend.vect[0] < 0) {
            local_118c.smallend.vect[0] = local_118c.smallend.vect[0] + 1;
            if (local_118c.smallend.vect[0] < 1) {
              local_118c.smallend.vect[0] = -local_118c.smallend.vect[0];
            }
            local_15a4 = -local_118c.smallend.vect[0] / local_740 + -1;
          }
          else {
            local_15a4 = local_118c.smallend.vect[0] / local_740;
          }
          local_738 = local_15a4;
        }
      }
      local_748 = (int)((ulong)local_1164 >> 0x20);
      local_74c = *(int *)(in_RDI + 0x7dc);
      local_744 = local_748;
      if (local_74c != 1) {
        if (local_74c == 2) {
          if (local_1164 < 0) {
            iVar4 = local_748 + 1;
            if (iVar4 < 1) {
              iVar4 = -iVar4;
            }
            local_15ac = -iVar4 / 2 + -1;
          }
          else {
            local_15ac = local_748 / 2;
          }
          local_744 = local_15ac;
        }
        else if (local_74c == 4) {
          if (local_1164 < 0) {
            iVar4 = local_748 + 1;
            if (iVar4 < 1) {
              iVar4 = -iVar4;
            }
            local_15b0 = -iVar4 / 4 + -1;
          }
          else {
            local_15b0 = local_748 / 4;
          }
          local_744 = local_15b0;
        }
        else {
          if (local_1164 < 0) {
            iVar4 = local_748 + 1;
            if (iVar4 < 1) {
              iVar4 = -iVar4;
            }
            local_15b4 = -iVar4 / local_74c + -1;
          }
          else {
            local_15b4 = local_748 / local_74c;
          }
          local_744 = local_15b4;
        }
      }
      local_118c.smallend.vect[2] = (int)local_115c;
      local_754 = local_118c.smallend.vect[2];
      local_758 = *(int *)(in_RDI + 0x7e0);
      local_750 = local_754;
      if (local_758 != 1) {
        if (local_758 == 2) {
          if (local_118c.smallend.vect[2] < 0) {
            local_118c.smallend.vect[2] = local_118c.smallend.vect[2] + 1;
            if (local_118c.smallend.vect[2] < 1) {
              local_118c.smallend.vect[2] = -local_118c.smallend.vect[2];
            }
            local_15bc = -local_118c.smallend.vect[2] / 2 - 1;
          }
          else {
            local_15bc = local_118c.smallend.vect[2] / 2;
          }
          local_750 = local_15bc;
        }
        else if (local_758 == 4) {
          if (local_118c.smallend.vect[2] < 0) {
            local_118c.smallend.vect[2] = local_118c.smallend.vect[2] + 1;
            if (local_118c.smallend.vect[2] < 1) {
              local_118c.smallend.vect[2] = -local_118c.smallend.vect[2];
            }
            local_15c0 = -local_118c.smallend.vect[2] / 4 - 1;
          }
          else {
            local_15c0 = local_118c.smallend.vect[2] / 4;
          }
          local_750 = local_15c0;
        }
        else {
          if (local_118c.smallend.vect[2] < 0) {
            local_118c.smallend.vect[2] = local_118c.smallend.vect[2] + 1;
            if (local_118c.smallend.vect[2] < 1) {
              local_118c.smallend.vect[2] = -local_118c.smallend.vect[2];
            }
            local_15c4 = -local_118c.smallend.vect[2] / local_758 - 1;
          }
          else {
            local_15c4 = local_118c.smallend.vect[2] / local_758;
          }
          local_750 = local_15c4;
        }
      }
      local_6e0 = &local_118c.btype;
      local_768 = local_10e8;
      local_760 = local_818;
      if (local_114c == 0) {
        local_780 = &local_118c.bigend;
        local_6f8 = *local_10e8;
        local_6f0 = local_118c.bigend.vect[0];
        if (local_6f8 != 1) {
          if (local_6f8 == 2) {
            if (local_115c < 0) {
              iVar4 = local_118c.bigend.vect[0] + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_160c = -iVar4 / 2 + -1;
            }
            else {
              local_160c = local_118c.bigend.vect[0] / 2;
            }
            local_6f0 = local_160c;
          }
          else if (local_6f8 == 4) {
            if (local_115c < 0) {
              iVar4 = local_118c.bigend.vect[0] + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_1610 = -iVar4 / 4 + -1;
            }
            else {
              local_1610 = local_118c.bigend.vect[0] / 4;
            }
            local_6f0 = local_1610;
          }
          else {
            if (local_115c < 0) {
              iVar4 = local_118c.bigend.vect[0] + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_1614 = -iVar4 / local_6f8 + -1;
            }
            else {
              local_1614 = local_118c.bigend.vect[0] / local_6f8;
            }
            local_6f0 = local_1614;
          }
        }
        local_118c.bigend.vect[1] = (int)local_1154;
        local_700 = local_118c.bigend.vect[1];
        local_704 = *(int *)(in_RDI + 0x7dc);
        local_6fc = local_700;
        if (local_704 != 1) {
          if (local_704 == 2) {
            if (local_118c.bigend.vect[1] < 0) {
              local_118c.bigend.vect[1] = local_118c.bigend.vect[1] + 1;
              if (local_118c.bigend.vect[1] < 1) {
                local_118c.bigend.vect[1] = -local_118c.bigend.vect[1];
              }
              local_161c = -local_118c.bigend.vect[1] / 2 + -1;
            }
            else {
              local_161c = local_118c.bigend.vect[1] / 2;
            }
            local_6fc = local_161c;
          }
          else if (local_704 == 4) {
            if (local_118c.bigend.vect[1] < 0) {
              local_118c.bigend.vect[1] = local_118c.bigend.vect[1] + 1;
              if (local_118c.bigend.vect[1] < 1) {
                local_118c.bigend.vect[1] = -local_118c.bigend.vect[1];
              }
              local_1620 = -local_118c.bigend.vect[1] / 4 + -1;
            }
            else {
              local_1620 = local_118c.bigend.vect[1] / 4;
            }
            local_6fc = local_1620;
          }
          else {
            if (local_118c.bigend.vect[1] < 0) {
              local_118c.bigend.vect[1] = local_118c.bigend.vect[1] + 1;
              if (local_118c.bigend.vect[1] < 1) {
                local_118c.bigend.vect[1] = -local_118c.bigend.vect[1];
              }
              local_1624 = -local_118c.bigend.vect[1] / local_704 + -1;
            }
            else {
              local_1624 = local_118c.bigend.vect[1] / local_704;
            }
            local_6fc = local_1624;
          }
        }
        local_70c = (int)((ulong)local_1154 >> 0x20);
        local_710 = *(int *)(in_RDI + 0x7e0);
        local_788 = local_10e8;
        local_708 = local_70c;
        local_6f4 = local_118c.bigend.vect[0];
        if (local_710 != 1) {
          if (local_710 == 2) {
            if (local_1154 < 0) {
              iVar4 = local_70c + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_162c = -iVar4 / 2 + -1;
            }
            else {
              local_162c = local_70c / 2;
            }
            local_708 = local_162c;
          }
          else if (local_710 == 4) {
            if (local_1154 < 0) {
              iVar4 = local_70c + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_1630 = -iVar4 / 4 + -1;
            }
            else {
              local_1630 = local_70c / 4;
            }
            local_708 = local_1630;
          }
          else {
            if (local_1154 < 0) {
              iVar4 = local_70c + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_1634 = -iVar4 / local_710 + -1;
            }
            else {
              local_1634 = local_70c / local_710;
            }
            local_708 = local_1634;
          }
        }
      }
      else {
        IntVect::IntVect(&local_82c,0);
        for (local_830 = 0; local_830 < 3; local_830 = local_830 + 1) {
          local_7e8 = &local_118c.btype;
          local_7ec = local_830;
          local_7dc = local_830;
          local_7cc = local_830;
          if ((local_118c.btype.itype & 1 << ((byte)local_830 & 0x1f)) != 0) {
            local_808 = &local_118c.bigend;
            local_80c = local_830;
            local_7f8 = local_820;
            local_7fc = local_830;
            if (local_808->vect[local_830] % local_820[local_830] != 0) {
              local_6d0 = &local_82c;
              local_6d4 = local_830;
              local_6d8 = 1;
              local_6d0->vect[local_830] = 1;
            }
          }
          local_7d8 = local_7e8;
        }
        local_770 = &local_118c.bigend;
        local_778 = local_820;
        local_718 = local_118c.bigend.vect[0];
        local_71c = *local_820;
        local_714 = local_718;
        if (local_71c != 1) {
          if (local_71c == 2) {
            if (local_118c.bigend.vect[0] < 0) {
              local_118c.bigend.vect[0] = local_118c.bigend.vect[0] + 1;
              if (local_118c.bigend.vect[0] < 1) {
                local_118c.bigend.vect[0] = -local_118c.bigend.vect[0];
              }
              local_15d4 = -local_118c.bigend.vect[0] / 2 + -1;
            }
            else {
              local_15d4 = local_118c.bigend.vect[0] / 2;
            }
            local_714 = local_15d4;
          }
          else if (local_71c == 4) {
            if (local_118c.bigend.vect[0] < 0) {
              local_118c.bigend.vect[0] = local_118c.bigend.vect[0] + 1;
              if (local_118c.bigend.vect[0] < 1) {
                local_118c.bigend.vect[0] = -local_118c.bigend.vect[0];
              }
              local_15d8 = -local_118c.bigend.vect[0] / 4 + -1;
            }
            else {
              local_15d8 = local_118c.bigend.vect[0] / 4;
            }
            local_714 = local_15d8;
          }
          else {
            if (local_118c.bigend.vect[0] < 0) {
              local_118c.bigend.vect[0] = local_118c.bigend.vect[0] + 1;
              if (local_118c.bigend.vect[0] < 1) {
                local_118c.bigend.vect[0] = -local_118c.bigend.vect[0];
              }
              local_15dc = -local_118c.bigend.vect[0] / local_71c + -1;
            }
            else {
              local_15dc = local_118c.bigend.vect[0] / local_71c;
            }
            local_714 = local_15dc;
          }
        }
        local_724 = local_118c.bigend.vect[1];
        local_728 = local_820[1];
        local_720 = local_724;
        if (local_728 != 1) {
          if (local_728 == 2) {
            if (local_118c.bigend.vect[1] < 0) {
              iVar4 = local_118c.bigend.vect[1] + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_15e4 = -iVar4 / 2 + -1;
            }
            else {
              local_15e4 = local_118c.bigend.vect[1] / 2;
            }
            local_720 = local_15e4;
          }
          else if (local_728 == 4) {
            if (local_118c.bigend.vect[1] < 0) {
              iVar4 = local_118c.bigend.vect[1] + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_15e8 = -iVar4 / 4 + -1;
            }
            else {
              local_15e8 = local_118c.bigend.vect[1] / 4;
            }
            local_720 = local_15e8;
          }
          else {
            if (local_118c.bigend.vect[1] < 0) {
              iVar4 = local_118c.bigend.vect[1] + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_15ec = -iVar4 / local_728 + -1;
            }
            else {
              local_15ec = local_118c.bigend.vect[1] / local_728;
            }
            local_720 = local_15ec;
          }
        }
        local_730 = local_118c.bigend.vect[2];
        local_734 = local_820[2];
        local_72c = local_730;
        if (local_734 != 1) {
          if (local_734 == 2) {
            if ((long)local_118c.bigend.vect._4_8_ < 0) {
              iVar4 = local_730 + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_15f4 = -iVar4 / 2 + -1;
            }
            else {
              local_15f4 = local_730 / 2;
            }
            local_72c = local_15f4;
          }
          else if (local_734 == 4) {
            if ((long)local_118c.bigend.vect._4_8_ < 0) {
              iVar4 = local_730 + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_15f8 = -iVar4 / 4 + -1;
            }
            else {
              local_15f8 = local_730 / 4;
            }
            local_72c = local_15f8;
          }
          else {
            if ((long)local_118c.bigend.vect._4_8_ < 0) {
              iVar4 = local_730 + 1;
              if (iVar4 < 1) {
                iVar4 = -iVar4;
              }
              local_15fc = -iVar4 / local_734 + -1;
            }
            else {
              local_15fc = local_730 / local_734;
            }
            local_72c = local_15fc;
          }
        }
        local_7c0 = &local_118c.bigend;
        local_7c8 = &local_82c;
        local_794 = 0;
        local_7a4 = 1;
        local_7b4 = 2;
        local_7b0 = local_7c8;
        local_7a0 = local_7c8;
        local_790 = local_7c8;
      }
    }
    local_1170 = &local_118c;
    this_00 = (BaseFab<double> *)(in_RDI + 0x7d8);
    src = (BaseFab<double> *)local_11b4;
    local_58c = 1;
    bVar3 = true;
    if ((*(int *)&this_00->_vptr_BaseFab == 1) && (bVar3 = true, *(int *)(in_RDI + 0x7dc) == 1)) {
      bVar3 = *(int *)(in_RDI + 0x7e0) != 1;
    }
    local_10d8 = this_00;
    local_10d0 = local_1170;
    local_660 = this_00;
    local_658 = src;
    local_588 = this_00;
    if (bVar3) {
      IntVect::IntVect(&local_66c,1);
      local_570 = &src->domain;
      uVar1 = (local_570->smallend).vect[0];
      IntVect::IntVect(&local_564,uVar1 & 1,uVar1 >> 1 & 1,uVar1 >> 2 & 1);
      local_578 = local_564.vect[2];
      local_580[0] = local_564.vect[0];
      local_580[1] = local_564.vect[1];
      local_680 = local_564.vect[2];
      local_688[0] = local_564.vect[0];
      local_688[1] = local_564.vect[1];
      local_678 = local_564.vect[0];
      iStack_674 = local_564.vect[1];
      uVar2 = _local_678;
      local_670 = local_564.vect[2];
      local_5c8 = &local_66c;
      local_5d0 = &local_678;
      local_59c = 0;
      local_678 = local_564.vect[0];
      local_66c.vect[0] = local_66c.vect[0] - local_678;
      local_5ac = 1;
      iStack_674 = local_564.vect[1];
      local_66c.vect[1] = local_66c.vect[1] - iStack_674;
      local_5bc = 2;
      local_66c.vect[2] = local_66c.vect[2] - local_564.vect[2];
      local_518 = local_660;
      local_4e0 = local_660;
      local_4e4 = 0;
      pBVar13 = src;
      _local_678 = uVar2;
      local_5b8 = local_5d0;
      local_5a8 = local_5d0;
      local_598 = local_5d0;
      local_510 = src;
      *(int *)&src->_vptr_BaseFab = *(int *)&local_660->_vptr_BaseFab * *(int *)&src->_vptr_BaseFab;
      local_4f0 = local_518;
      local_4f4 = 1;
      *(int *)((long)&src->_vptr_BaseFab + 4) =
           *(int *)((long)&local_518->_vptr_BaseFab + 4) * *(int *)((long)&src->_vptr_BaseFab + 4);
      local_500 = local_518;
      local_504 = 2;
      *(int *)&(src->super_DataAllocator).m_arena =
           *(int *)&(local_518->super_DataAllocator).m_arena *
           *(int *)&(src->super_DataAllocator).m_arena;
      local_648 = (int *)((long)&(src->super_DataAllocator).m_arena + 4);
      local_650 = &local_66c;
      local_61c = 0;
      local_618 = local_650;
      *local_648 = local_66c.vect[0] + *local_648;
      local_628 = local_650;
      local_62c = 1;
      *(int *)&src->dptr = local_650->vect[1] + *(int *)&src->dptr;
      local_638 = local_650;
      local_63c = 2;
      *(int *)((long)&src->dptr + 4) = local_650->vect[2] + *(int *)((long)&src->dptr + 4);
      local_550 = (int *)((long)&(src->super_DataAllocator).m_arena + 4);
      local_558 = local_660;
      local_520 = local_660;
      local_524 = 0;
      *local_550 = *(int *)&local_660->_vptr_BaseFab * *local_550;
      local_530 = local_558;
      local_534 = 1;
      *(int *)&src->dptr = *(int *)((long)&local_558->_vptr_BaseFab + 4) * *(int *)&src->dptr;
      local_540 = local_558;
      local_544 = 2;
      *(int *)((long)&src->dptr + 4) =
           *(int *)&(local_558->super_DataAllocator).m_arena * *(int *)((long)&src->dptr + 4);
      local_608 = (int *)((long)&(src->super_DataAllocator).m_arena + 4);
      local_610 = &local_66c;
      local_5dc = 0;
      local_5d8 = local_610;
      *local_608 = *local_608 - local_66c.vect[0];
      local_5e8 = local_610;
      local_5ec = 1;
      *(int *)&src->dptr = *(int *)&src->dptr - local_610->vect[1];
      local_5f8 = local_610;
      local_5fc = 2;
      *(int *)((long)&src->dptr + 4) = *(int *)((long)&src->dptr + 4) - local_610->vect[2];
      src = pBVar13;
    }
    local_11b4._28_8_ = local_11b4;
    local_11b8 = FabArrayBase::nComp((FabArrayBase *)(in_RDI + 0x318));
    local_10c0 = (int *)(in_RDI + 0x7d8);
    local_10a4 = 0;
    local_10b4 = 1;
    local_10c4 = 2;
    local_11c0 = (double)(*local_10c0 * *(int *)(in_RDI + 0x7dc) * *(int *)(in_RDI + 0x7e0));
    local_11d8 = local_1130 / (*local_1128 * local_11c0);
    local_11d0 = local_1130 / (local_1128[1] * local_11c0);
    local_11c8 = local_1130 / (local_1128[2] * local_11c0);
    local_107c = *local_10c0;
    uStack_1078 = *(undefined4 *)(in_RDI + 0x7dc);
    local_11f8 = *(undefined8 *)local_10c0;
    local_11f0 = *(int *)(in_RDI + 0x7e0);
    local_11e4 = local_11f8;
    local_11dc = local_11f0;
    local_10b0 = local_10c0;
    local_10a0 = local_10c0;
    local_1098 = local_11f8;
    local_1090 = local_11f0;
    local_1088 = local_10c0;
    local_1074 = local_11f0;
    ppFVar5 = std::array<const_amrex::FArrayBox_*,_3UL>::operator[]
                        ((array<const_amrex::FArrayBox_*,_3UL> *)in_stack_ffffffffffffe960,
                         (size_type)in_stack_ffffffffffffe958);
    local_1210 = *ppFVar5;
    ppFVar5 = std::array<const_amrex::FArrayBox_*,_3UL>::operator[]
                        ((array<const_amrex::FArrayBox_*,_3UL> *)in_stack_ffffffffffffe960,
                         (size_type)in_stack_ffffffffffffe958);
    local_1208 = *ppFVar5;
    ppFVar5 = std::array<const_amrex::FArrayBox_*,_3UL>::operator[]
                        ((array<const_amrex::FArrayBox_*,_3UL> *)in_stack_ffffffffffffe960,
                         (size_type)in_stack_ffffffffffffe958);
    local_1200 = *ppFVar5;
    local_1649 = false;
    if (local_1134 == 0) {
      local_1649 = Gpu::inLaunchRegion();
    }
    local_1211 = local_1649;
    local_1070 = &local_1211;
    std::array<amrex::FArrayBox,_3UL>::array(in_stack_ffffffffffffe970);
    bVar3 = Box::operator!=((Box *)in_stack_ffffffffffffe960,in_stack_ffffffffffffe958);
    if (bVar3) {
      for (local_12f4 = 0; local_12f4 < 3; local_12f4 = local_12f4 + 1) {
        local_1060 = (undefined8 *)local_11b4._28_8_;
        local_1064 = local_12f4;
        local_131c = *(undefined8 *)local_11b4._28_8_;
        local_1314 = *(undefined8 *)(local_11b4._28_8_ + 8);
        uVar2 = *(undefined8 *)(local_11b4._28_8_ + 0x10);
        uVar1 = *(uint *)(local_11b4._28_8_ + 0x18);
        local_4d4 = local_12f4;
        local_4b4 = local_12f4;
        local_4a4 = local_12f4;
        local_498 = local_12f4;
        local_1304 = uVar1;
        if ((uVar1 & 1 << ((byte)local_12f4 & 0x1f)) == 0) {
          lVar11 = (long)&local_1314 + 4;
          local_4c4 = local_12f4;
          local_4c8 = 1;
          *(int *)(lVar11 + (long)local_12f4 * 4) = *(int *)(lVar11 + (long)local_12f4 * 4) + 1;
          local_490 = &local_1304;
          local_494 = local_12f4;
          local_484 = local_12f4;
          local_1304 = 1 << ((byte)local_12f4 & 0x1f) | uVar1;
          local_4c0 = lVar11;
        }
        local_1300 = &local_131c;
        local_130c = uVar2;
        local_4d0 = &local_131c;
        local_4b0 = &local_1304;
        local_4a0 = &local_1304;
        std::array<amrex::FArrayBox,_3UL>::operator[]
                  ((array<amrex::FArrayBox,_3UL> *)in_stack_ffffffffffffe960,
                   (size_type)in_stack_ffffffffffffe958);
        FArrayBox::resize(in_stack_ffffffffffffe970->_M_elems,in_stack_ffffffffffffe968,
                          (int)((ulong)in_stack_ffffffffffffe960 >> 0x20),
                          (Arena *)in_stack_ffffffffffffe958);
        std::array<amrex::FArrayBox,_3UL>::operator[]
                  ((array<amrex::FArrayBox,_3UL> *)in_stack_ffffffffffffe960,
                   (size_type)in_stack_ffffffffffffe958);
        local_1328 = 0;
        BaseFab<double>::setVal<(amrex::RunOn)1>
                  (in_stack_ffffffffffffe980,(double *)in_stack_ffffffffffffe978);
        std::array<amrex::FArrayBox,_3UL>::operator[]
                  ((array<amrex::FArrayBox,_3UL> *)in_stack_ffffffffffffe960,
                   (size_type)in_stack_ffffffffffffe958);
        std::array<const_amrex::FArrayBox_*,_3UL>::operator[]
                  ((array<const_amrex::FArrayBox_*,_3UL> *)in_stack_ffffffffffffe960,
                   (size_type)in_stack_ffffffffffffe958);
        BaseFab<double>::copy<(amrex::RunOn)1>(this_00,src);
        pvVar6 = std::array<amrex::FArrayBox,_3UL>::operator[]
                           ((array<amrex::FArrayBox,_3UL> *)in_stack_ffffffffffffe960,
                            (size_type)in_stack_ffffffffffffe958);
        ppFVar8 = std::array<const_amrex::FArrayBox_*,_3UL>::operator[]
                            ((array<const_amrex::FArrayBox_*,_3UL> *)in_stack_ffffffffffffe960,
                             (size_type)in_stack_ffffffffffffe958);
        *ppFVar8 = pvVar6;
      }
    }
    for (local_132c = 0; (int)local_132c < 3; local_132c = local_132c + 1) {
      local_1020 = local_1170;
      local_1024 = local_132c;
      local_1028 = 1;
      pIVar7 = Box::smallEnd(local_1170);
      local_1038.vect[2] = pIVar7->vect[2];
      local_1038.vect._0_8_ = *(undefined8 *)pIVar7->vect;
      pIVar7 = Box::bigEnd(local_1020);
      iVar4 = pIVar7->vect[2];
      uVar2 = *(undefined8 *)pIVar7->vect;
      pIVar7 = &local_1038;
      local_1014 = local_1024;
      local_104c = pIVar7->vect[(int)local_1024];
      local_694 = local_1024;
      pIVar7->vect[(int)local_1024] = local_104c - local_1028;
      local_6a4 = local_1024;
      local_1048.vect[(int)local_1024] = local_104c + -1;
      local_1048.vect._0_8_ = uVar2;
      local_1048.vect[2] = iVar4;
      local_1010 = pIVar7;
      local_6a8 = local_104c + -1;
      local_6a0 = &local_1048;
      local_698 = local_104c - local_1028;
      local_690 = pIVar7;
      local_1054 = (uint)Box::ixType(local_1020);
      local_960 = &local_1050;
      local_964 = local_1024;
      local_954 = local_1024;
      local_1054 = local_1054 & ~(1 << (local_1024 & 0x1f));
      local_1050 = local_1054;
      Box::Box(&local_1354,pIVar7,&local_1048,(IndexType)local_1054);
      local_fb0 = local_1170;
      local_fb4 = local_132c;
      local_fb8 = 1;
      local_1338 = &local_1354;
      pIVar7 = Box::smallEnd(local_1170);
      local_fc8.vect[2] = pIVar7->vect[2];
      local_fc8.vect._0_8_ = *(undefined8 *)pIVar7->vect;
      pIVar7 = Box::bigEnd(local_fb0);
      local_fd8.vect[2] = pIVar7->vect[2];
      local_fd8.vect._0_8_ = *(undefined8 *)pIVar7->vect;
      IVar12 = Box::type(in_stack_ffffffffffffe978);
      local_ff8._0_8_ = IVar12.vect._0_8_;
      local_fe8._0_4_ = local_ff8[0];
      local_fe8._4_4_ = local_ff8[1];
      local_ff8[2] = IVar12.vect[2];
      local_fe0 = local_ff8[2];
      local_f94 = local_fb4;
      local_fdc = *(uint *)((long)&local_fe8 + (long)(int)local_fb4 * 4);
      local_fa4 = local_fb4;
      local_ffc = (local_fd8.vect[(int)local_fb4] + 1) - (local_fdc & 1);
      local_6b4 = local_fb4;
      local_fc8.vect[(int)local_fb4] = local_ffc;
      iVar4 = local_ffc + local_fb8 + -1;
      local_6c4 = local_fb4;
      local_fd8.vect[(int)local_fb4] = iVar4;
      local_ff8 = IVar12.vect;
      local_fa0 = &local_fd8;
      local_f90 = &local_fe8;
      local_6c8 = iVar4;
      local_6c0 = &local_fd8;
      local_6b8 = local_ffc;
      local_6b0 = &local_fc8;
      local_1004 = (uint)Box::ixType(local_fb0);
      local_970 = &local_1000;
      local_974 = local_fb4;
      local_968 = local_fb4;
      local_1004 = (1 << ((byte)local_fb4 & 0x1f) ^ 0xffffffffU) & local_1004;
      local_1000 = local_1004;
      Box::Box(&local_137c,&local_fc8,&local_fd8,(IndexType)local_1004);
      local_1360 = &local_137c;
      ppFVar8 = std::array<const_amrex::FArrayBox_*,_3UL>::operator[]
                          ((array<const_amrex::FArrayBox_*,_3UL> *)in_stack_ffffffffffffe960,
                           (size_type)in_stack_ffffffffffffe958);
      local_1388 = *ppFVar8;
      local_1390 = local_1140;
      local_1398._M_current =
           (FArrayBox **)
           std::vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>::begin
                     ((vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_> *)
                      in_stack_ffffffffffffe958);
      local_13a0 = (FArrayBox **)
                   std::vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>::end
                             ((vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_> *)
                              in_stack_ffffffffffffe958);
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<amrex::FArrayBox_**,_std::vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>
                                 *)in_stack_ffffffffffffe960,
                                (__normal_iterator<amrex::FArrayBox_**,_std::vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>
                                 *)in_stack_ffffffffffffe958), bVar3) {
        ppFVar9 = __gnu_cxx::
                  __normal_iterator<amrex::FArrayBox_**,_std::vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>
                  ::operator*(&local_1398);
        local_13a8 = &(*ppFVar9)->super_BaseFab<double>;
        in_stack_ffffffffffffe978 = local_1338;
        BaseFab<double>::box(local_13a8);
        Box::operator&((Box *)in_stack_ffffffffffffe960,in_stack_ffffffffffffe958);
        local_13b0 = &local_13cc;
        local_13d0 = 0;
        bVar3 = Box::ok(local_13b0);
        uVar2 = local_1488;
        if (bVar3) {
          local_f80 = local_13a8;
          local_198 = local_13a8->dptr;
          local_1a0 = &local_13a8->domain;
          local_1a4 = local_13a8->nvar;
          local_14c = 0;
          local_178 = (local_1a0->smallend).vect[0];
          local_15c = 1;
          iStack_174 = (local_13a8->domain).smallend.vect[1];
          local_1c0.x = (local_1a0->smallend).vect[0];
          local_1c0.y = (local_1a0->smallend).vect[1];
          local_16c = 2;
          local_1c0.z = (local_13a8->domain).smallend.vect[2];
          local_f8 = &(local_13a8->domain).bigend;
          local_fc = 0;
          local_128 = local_f8->vect[0] + 1;
          local_108 = &(local_13a8->domain).bigend;
          local_10c = 1;
          iStack_124 = (local_13a8->domain).bigend.vect[1] + 1;
          local_118 = &(local_13a8->domain).bigend;
          local_11c = 2;
          local_1e0.z = (local_13a8->domain).bigend.vect[2] + 1;
          local_1e0.y = iStack_124;
          local_1e0.x = local_128;
          local_1d0._0_8_ = local_1e0._0_8_;
          local_1d0.z = local_1e0.z;
          local_1b0._0_8_ = local_1c0._0_8_;
          local_1b0.z = local_1c0.z;
          local_190._0_8_ = local_1c0._0_8_;
          local_190.z = local_1c0.z;
          local_180 = local_1a0;
          local_170 = local_1c0.z;
          local_168 = local_1a0;
          local_158 = local_1a0;
          local_148 = local_1a0;
          local_140._0_8_ = local_1e0._0_8_;
          local_140.z = local_1e0.z;
          local_130 = local_1a0;
          local_120 = local_1e0.z;
          Array4<double>::Array4(&local_1410,local_198,&local_1b0,&local_1d0,local_1a4);
          pvVar10 = std::array<double,_3UL>::operator[]
                              ((array<double,_3UL> *)in_stack_ffffffffffffe960,
                               (size_type)in_stack_ffffffffffffe958);
          local_1418 = *pvVar10;
          local_141c = local_132c * 2;
          local_1100 = local_1388;
          local_378 = (local_1388->super_BaseFab<double>).dptr;
          local_380 = &(local_1388->super_BaseFab<double>).domain;
          local_384 = (local_1388->super_BaseFab<double>).nvar;
          local_32c = 0;
          local_358 = (local_380->smallend).vect[0];
          local_33c = 1;
          iStack_354 = (local_1388->super_BaseFab<double>).domain.smallend.vect[1];
          local_3a0.x = (local_380->smallend).vect[0];
          local_3a0.y = (local_380->smallend).vect[1];
          local_34c = 2;
          local_3a0.z = (local_1388->super_BaseFab<double>).domain.smallend.vect[2];
          local_2d8 = &(local_1388->super_BaseFab<double>).domain.bigend;
          local_2dc = 0;
          local_308 = local_2d8->vect[0] + 1;
          local_2e8 = &(local_1388->super_BaseFab<double>).domain.bigend;
          local_2ec = 1;
          iStack_304 = (local_1388->super_BaseFab<double>).domain.bigend.vect[1] + 1;
          local_2f8 = &(local_1388->super_BaseFab<double>).domain.bigend;
          local_2fc = 2;
          local_3c0.z = (local_1388->super_BaseFab<double>).domain.bigend.vect[2] + 1;
          local_3c0.y = iStack_304;
          local_3c0.x = local_308;
          local_3ac._0_8_ = local_3c0._0_8_;
          local_3ac.z = local_3c0.z;
          local_390._0_8_ = local_3a0._0_8_;
          local_390.z = local_3a0.z;
          local_370._0_8_ = local_3a0._0_8_;
          local_370.z = local_3a0.z;
          local_360 = local_380;
          local_350 = local_3a0.z;
          local_348 = local_380;
          local_338 = local_380;
          local_328 = local_380;
          local_320._0_8_ = local_3c0._0_8_;
          local_320.z = local_3c0.z;
          local_310 = local_380;
          local_300 = local_3c0.z;
          Array4<const_double>::Array4(&local_1460,local_378,&local_390,&local_3ac,local_384);
          local_10f0 = &local_1134;
          local_c48 = *(undefined8 *)(local_13b0->smallend).vect;
          uVar2 = *(undefined8 *)((local_13b0->smallend).vect + 2);
          uStack_1474 = *(undefined8 *)((local_13b0->bigend).vect + 2);
          iStack_1478 = (int)((ulong)*(undefined8 *)(local_13b0->bigend).vect >> 0x20);
          iStack_1480 = (int)uVar2;
          local_147c = (int)((ulong)uVar2 >> 0x20);
          local_c00 = &local_1488;
          local_c08 = &local_1410;
          local_c10 = &local_1460;
          local_c18 = local_1418;
          local_c1c = local_11b8;
          local_c20 = local_141c;
          local_c28 = &local_11e4;
          local_984 = 0;
          local_1488._0_4_ = (int)local_c48;
          local_bdc = (int)local_1488;
          local_994 = 1;
          local_1488._4_4_ = (int)((ulong)local_c48 >> 0x20);
          iStack_bd8 = local_1488._4_4_;
          local_9a4 = 2;
          local_c40 = iStack_1480;
          local_9e0 = &local_147c;
          local_9e4 = 0;
          local_b8c = local_147c;
          local_9f0 = &local_147c;
          local_9f4 = 1;
          iStack_b88 = iStack_1478;
          local_c68 = CONCAT44(iStack_1478,local_147c);
          local_a00 = &local_147c;
          local_a04 = 2;
          local_c60 = (int)uStack_1474;
          in_stack_ffffffffffffe970 = (array<amrex::FArrayBox,_3UL> *)(ulong)local_141c;
          uVar2 = local_c48;
          local_c58 = local_c68;
          local_c50 = local_c60;
          local_c38 = local_c48;
          local_c30 = local_c40;
          local_bf8 = local_c48;
          local_bf0 = local_c40;
          local_be8 = local_c00;
          local_bd4 = local_c40;
          local_ba8 = local_c68;
          local_ba0 = local_c60;
          local_b98 = local_c00;
          local_b84 = local_c60;
          local_9a0 = local_c00;
          local_990 = local_c00;
          local_980 = local_c00;
          switch(in_stack_ffffffffffffe970) {
          case (array<amrex::FArrayBox,_3UL> *)0x0:
            for (local_c6c = 0; iVar4 = local_c40, local_c6c < local_11b8; local_c6c = local_c6c + 1
                ) {
              while (local_c70 = iVar4, iVar4 = iStack_bd8, local_c70 <= (int)uStack_1474) {
                while (local_c74 = iVar4, local_c74 <= iStack_1478) {
                  local_c7c = ((int)local_1488 + 1) * (int)local_11e4;
                  local_b38 = local_c74;
                  local_b3c = local_c70;
                  local_b40 = local_c6c;
                  local_c88 = local_1410.p +
                              (long)((int)local_1488 - local_1410.begin.x) +
                              (local_c74 - local_1410.begin.y) * local_1410.jstride +
                              (local_c70 - local_1410.begin.z) * local_1410.kstride +
                              local_c6c * local_1410.nstride;
                  for (local_c8c = 0; local_c8c < local_11dc; local_c8c = local_c8c + 1) {
                    local_c90 = local_c70 * local_11dc + local_c8c;
                    for (local_c94 = 0; local_c94 < local_11e4._4_4_; local_c94 = local_c94 + 1) {
                      local_c98 = local_c74 * local_11e4._4_4_ + local_c94;
                      local_938 = local_c6c;
                      local_ca0 = -local_1418 *
                                  local_1460.p
                                  [(long)(local_c7c - local_1460.begin.x) +
                                   (local_c98 - local_1460.begin.y) * local_1460.jstride +
                                   (local_c90 - local_1460.begin.z) * local_1460.kstride +
                                   local_c6c * local_1460.nstride];
                      *local_c88 = local_ca0 + *local_c88;
                      local_934 = local_c90;
                      local_930 = local_c98;
                      local_92c = local_c7c;
                      local_928 = local_c10;
                      local_470 = local_ca0;
                      local_468 = local_c88;
                    }
                  }
                  local_c78 = local_bdc;
                  local_b34 = local_bdc;
                  local_b30 = local_c08;
                  iVar4 = local_c74 + 1;
                }
                iVar4 = local_c70 + 1;
              }
            }
            break;
          case (array<amrex::FArrayBox,_3UL> *)0x2:
            for (local_cdc = 0; iVar4 = local_c40, local_cdc < local_11b8; local_cdc = local_cdc + 1
                ) {
              while (local_ce0 = iVar4, iVar4 = local_bdc, local_ce0 <= (int)uStack_1474) {
                while (local_ce4 = iVar4, local_ce4 <= local_147c) {
                  local_cec = (local_1488._4_4_ + 1) * local_11e4._4_4_;
                  local_b04 = local_ce4;
                  local_b0c = local_ce0;
                  local_b10 = local_cdc;
                  local_cf8 = local_1410.p +
                              (long)(local_ce4 - local_1410.begin.x) +
                              (local_1488._4_4_ - local_1410.begin.y) * local_1410.jstride +
                              (local_ce0 - local_1410.begin.z) * local_1410.kstride +
                              local_cdc * local_1410.nstride;
                  for (local_cfc = 0; local_cfc < local_11dc; local_cfc = local_cfc + 1) {
                    local_d00 = local_ce0 * local_11dc + local_cfc;
                    for (local_d04 = 0; local_d04 < (int)local_11e4; local_d04 = local_d04 + 1) {
                      local_d08 = local_ce4 * (int)local_11e4 + local_d04;
                      local_908 = local_cdc;
                      local_d10 = -local_1418 *
                                  local_1460.p
                                  [(long)(local_d08 - local_1460.begin.x) +
                                   (local_cec - local_1460.begin.y) * local_1460.jstride +
                                   (local_d00 - local_1460.begin.z) * local_1460.kstride +
                                   local_cdc * local_1460.nstride];
                      *local_cf8 = local_d10 + *local_cf8;
                      local_904 = local_d00;
                      local_900 = local_cec;
                      local_8fc = local_d08;
                      local_8f8 = local_c10;
                      local_450 = local_d10;
                      local_448 = local_cf8;
                    }
                  }
                  local_ce8 = iStack_bd8;
                  local_b08 = iStack_bd8;
                  local_b00 = local_c08;
                  iVar4 = local_ce4 + 1;
                }
                iVar4 = local_ce0 + 1;
              }
            }
            break;
          case (array<amrex::FArrayBox,_3UL> *)0x4:
            for (local_d4c = 0; iVar4 = iStack_bd8, local_d4c < local_11b8;
                local_d4c = local_d4c + 1) {
              while (local_d50 = iVar4, iVar4 = local_bdc, local_d50 <= iStack_1478) {
                while (local_d54 = iVar4, local_d54 <= local_147c) {
                  local_d5c = (iStack_1480 + 1) * local_11dc;
                  local_ad4 = local_d54;
                  local_ad8 = local_d50;
                  local_ae0 = local_d4c;
                  local_d68 = local_1410.p +
                              (long)(local_d54 - local_1410.begin.x) +
                              (local_d50 - local_1410.begin.y) * local_1410.jstride +
                              (iStack_1480 - local_1410.begin.z) * local_1410.kstride +
                              local_d4c * local_1410.nstride;
                  for (local_d6c = 0; local_d6c < local_11e4._4_4_; local_d6c = local_d6c + 1) {
                    local_d70 = local_d50 * local_11e4._4_4_ + local_d6c;
                    for (local_d74 = 0; local_d74 < (int)local_11e4; local_d74 = local_d74 + 1) {
                      local_d78 = local_d54 * (int)local_11e4 + local_d74;
                      local_8d8 = local_d4c;
                      local_d80 = -local_1418 *
                                  local_1460.p
                                  [(long)(local_d78 - local_1460.begin.x) +
                                   (local_d70 - local_1460.begin.y) * local_1460.jstride +
                                   (local_d5c - local_1460.begin.z) * local_1460.kstride +
                                   local_d4c * local_1460.nstride];
                      *local_d68 = local_d80 + *local_d68;
                      local_8d4 = local_d5c;
                      local_8d0 = local_d70;
                      local_8cc = local_d78;
                      local_8c8 = local_c10;
                      local_430 = local_d80;
                      local_428 = local_d68;
                    }
                  }
                  local_d58 = local_c40;
                  local_adc = local_c40;
                  local_ad0 = local_c08;
                  iVar4 = local_d54 + 1;
                }
                iVar4 = local_d50 + 1;
              }
            }
            break;
          default:
            for (local_d84 = 0; iVar4 = iStack_bd8, local_d84 < local_11b8;
                local_d84 = local_d84 + 1) {
              while (local_d88 = iVar4, iVar4 = local_bdc, local_d88 <= iStack_1478) {
                while (local_d8c = iVar4, local_d8c <= local_147c) {
                  local_d94 = iStack_1480 * local_11dc;
                  local_b4c = local_d8c;
                  local_b50 = local_d88;
                  local_b58 = local_d84;
                  local_da0 = local_1410.p +
                              (long)(local_d8c - local_1410.begin.x) +
                              (local_d88 - local_1410.begin.y) * local_1410.jstride +
                              (iStack_1480 - local_1410.begin.z) * local_1410.kstride +
                              local_d84 * local_1410.nstride;
                  for (local_da4 = 0; local_da4 < local_11e4._4_4_; local_da4 = local_da4 + 1) {
                    local_da8 = local_d88 * local_11e4._4_4_ + local_da4;
                    for (local_dac = 0; local_dac < (int)local_11e4; local_dac = local_dac + 1) {
                      local_db0 = local_d8c * (int)local_11e4 + local_dac;
                      local_950 = local_d84;
                      local_db8 = local_1418 *
                                  local_1460.p
                                  [(long)(local_db0 - local_1460.begin.x) +
                                   (local_da8 - local_1460.begin.y) * local_1460.jstride +
                                   (local_d94 - local_1460.begin.z) * local_1460.kstride +
                                   local_d84 * local_1460.nstride];
                      *local_da0 = local_db8 + *local_da0;
                      local_94c = local_d94;
                      local_948 = local_da8;
                      local_944 = local_db0;
                      local_940 = local_c10;
                      local_480 = local_db8;
                      local_478 = local_da0;
                    }
                  }
                  local_d90 = local_c40;
                  local_b54 = local_c40;
                  local_b48 = local_c08;
                  iVar4 = local_d8c + 1;
                }
                iVar4 = local_d88 + 1;
              }
            }
          }
        }
        local_1488 = uVar2;
        BaseFab<double>::box(local_13a8);
        Box::operator&((Box *)in_stack_ffffffffffffe960,in_stack_ffffffffffffe958);
        local_1490 = &local_14ac;
        local_14b0 = 1;
        bVar3 = Box::ok(local_1490);
        uVar2 = local_1568;
        if (bVar3) {
          local_f88 = local_13a8;
          local_a8 = local_13a8->dptr;
          local_b0 = &local_13a8->domain;
          local_b4 = local_13a8->nvar;
          local_5c = 0;
          local_88 = (local_b0->smallend).vect[0];
          local_6c = 1;
          iStack_84 = (local_13a8->domain).smallend.vect[1];
          local_d0.x = (local_b0->smallend).vect[0];
          local_d0.y = (local_b0->smallend).vect[1];
          local_7c = 2;
          local_d0.z = (local_13a8->domain).smallend.vect[2];
          local_8 = &(local_13a8->domain).bigend;
          local_c = 0;
          local_38 = local_8->vect[0] + 1;
          local_18 = &(local_13a8->domain).bigend;
          local_1c = 1;
          iStack_34 = (local_13a8->domain).bigend.vect[1] + 1;
          local_28 = &(local_13a8->domain).bigend;
          local_2c = 2;
          local_f0.z = (local_13a8->domain).bigend.vect[2] + 1;
          local_f0.y = iStack_34;
          local_f0.x = local_38;
          local_e0._0_8_ = local_f0._0_8_;
          local_e0.z = local_f0.z;
          local_c0._0_8_ = local_d0._0_8_;
          local_c0.z = local_d0.z;
          local_a0._0_8_ = local_d0._0_8_;
          local_a0.z = local_d0.z;
          local_90 = local_b0;
          local_80 = local_d0.z;
          local_78 = local_b0;
          local_68 = local_b0;
          local_58 = local_b0;
          local_50._0_8_ = local_f0._0_8_;
          local_50.z = local_f0.z;
          local_40 = local_b0;
          local_30 = local_f0.z;
          Array4<double>::Array4(&local_14f0,local_a8,&local_c0,&local_e0,local_b4);
          pvVar10 = std::array<double,_3UL>::operator[]
                              ((array<double,_3UL> *)in_stack_ffffffffffffe960,
                               (size_type)in_stack_ffffffffffffe958);
          local_14f8 = *pvVar10;
          local_14fc = local_132c * 2 + 1;
          local_1108 = local_1388;
          local_288 = (local_1388->super_BaseFab<double>).dptr;
          local_290 = &(local_1388->super_BaseFab<double>).domain;
          local_294 = (local_1388->super_BaseFab<double>).nvar;
          local_23c = 0;
          local_268 = (local_290->smallend).vect[0];
          local_24c = 1;
          iStack_264 = (local_1388->super_BaseFab<double>).domain.smallend.vect[1];
          local_2b0.x = (local_290->smallend).vect[0];
          local_2b0.y = (local_290->smallend).vect[1];
          local_25c = 2;
          local_2b0.z = (local_1388->super_BaseFab<double>).domain.smallend.vect[2];
          local_1e8 = &(local_1388->super_BaseFab<double>).domain.bigend;
          local_1ec = 0;
          local_218 = local_1e8->vect[0] + 1;
          local_1f8 = &(local_1388->super_BaseFab<double>).domain.bigend;
          local_1fc = 1;
          iStack_214 = (local_1388->super_BaseFab<double>).domain.bigend.vect[1] + 1;
          local_208 = &(local_1388->super_BaseFab<double>).domain.bigend;
          local_20c = 2;
          local_2d0.z = (local_1388->super_BaseFab<double>).domain.bigend.vect[2] + 1;
          local_2d0.y = iStack_214;
          local_2d0.x = local_218;
          local_2bc._0_8_ = local_2d0._0_8_;
          local_2bc.z = local_2d0.z;
          local_2a0._0_8_ = local_2b0._0_8_;
          local_2a0.z = local_2b0.z;
          local_280._0_8_ = local_2b0._0_8_;
          local_280.z = local_2b0.z;
          local_270 = local_290;
          local_260 = local_2b0.z;
          local_258 = local_290;
          local_248 = local_290;
          local_238 = local_290;
          local_230._0_8_ = local_2d0._0_8_;
          local_230.z = local_2d0.z;
          local_220 = local_290;
          local_210 = local_2d0.z;
          Array4<const_double>::Array4(&local_1540,local_288,&local_2a0,&local_2bc,local_294);
          local_10f8 = &local_1134;
          local_e08 = *(undefined8 *)(local_1490->smallend).vect;
          uVar2 = *(undefined8 *)((local_1490->smallend).vect + 2);
          uStack_1554 = *(undefined8 *)((local_1490->bigend).vect + 2);
          iStack_1558 = (int)((ulong)*(undefined8 *)(local_1490->bigend).vect >> 0x20);
          iStack_1560 = (int)uVar2;
          local_155c = (int)((ulong)uVar2 >> 0x20);
          local_dc0 = &local_1568;
          local_dc8 = &local_14f0;
          local_dd0 = &local_1540;
          local_dd8 = local_14f8;
          local_ddc = local_11b8;
          local_de0 = local_14fc;
          local_de8 = &local_11e4;
          local_9b4 = 0;
          local_1568._0_4_ = (int)local_e08;
          local_bb4 = (int)local_1568;
          local_9c4 = 1;
          local_1568._4_4_ = (int)((ulong)local_e08 >> 0x20);
          iStack_bb0 = local_1568._4_4_;
          local_9d4 = 2;
          local_e00 = iStack_1560;
          local_a10 = &local_155c;
          local_a14 = 0;
          local_b64 = local_155c;
          local_a20 = &local_155c;
          local_a24 = 1;
          iStack_b60 = iStack_1558;
          local_e28 = CONCAT44(iStack_1558,local_155c);
          local_a30 = &local_155c;
          local_a34 = 2;
          local_e20 = (int)uStack_1554;
          in_stack_ffffffffffffe960 = (MFIter *)(ulong)local_14fc;
          uVar2 = local_e08;
          local_e18 = local_e28;
          local_e10 = local_e20;
          local_df8 = local_e08;
          local_df0 = local_e00;
          local_bd0 = local_e08;
          local_bc8 = local_e00;
          local_bc0 = local_dc0;
          local_bac = local_e00;
          local_b80 = local_e28;
          local_b78 = local_e20;
          local_b70 = local_dc0;
          local_b5c = local_e20;
          local_9d0 = local_dc0;
          local_9c0 = local_dc0;
          local_9b0 = local_dc0;
          switch(in_stack_ffffffffffffe960) {
          case (MFIter *)0x0:
            for (local_e2c = 0; iVar4 = local_e00, local_e2c < local_11b8; local_e2c = local_e2c + 1
                ) {
              while (local_e30 = iVar4, iVar4 = iStack_bb0, local_e30 <= (int)uStack_1554) {
                while (local_e34 = iVar4, local_e34 <= iStack_1558) {
                  local_e3c = ((int)local_1568 + 1) * (int)local_11e4;
                  local_aa8 = local_e34;
                  local_aac = local_e30;
                  local_ab0 = local_e2c;
                  local_e48 = local_14f0.p +
                              (long)((int)local_1568 - local_14f0.begin.x) +
                              (local_e34 - local_14f0.begin.y) * local_14f0.jstride +
                              (local_e30 - local_14f0.begin.z) * local_14f0.kstride +
                              local_e2c * local_14f0.nstride;
                  for (local_e4c = 0; local_e4c < local_11dc; local_e4c = local_e4c + 1) {
                    local_e50 = local_e30 * local_11dc + local_e4c;
                    for (local_e54 = 0; local_e54 < local_11e4._4_4_; local_e54 = local_e54 + 1) {
                      local_e58 = local_e34 * local_11e4._4_4_ + local_e54;
                      local_8a8 = local_e2c;
                      local_e60 = -local_14f8 *
                                  local_1540.p
                                  [(long)(local_e3c - local_1540.begin.x) +
                                   (local_e58 - local_1540.begin.y) * local_1540.jstride +
                                   (local_e50 - local_1540.begin.z) * local_1540.kstride +
                                   local_e2c * local_1540.nstride];
                      *local_e48 = local_e60 + *local_e48;
                      local_8a4 = local_e50;
                      local_8a0 = local_e58;
                      local_89c = local_e3c;
                      local_898 = local_dd0;
                      local_410 = local_e60;
                      local_408 = local_e48;
                    }
                  }
                  local_e38 = local_bb4;
                  local_aa4 = local_bb4;
                  local_aa0 = local_dc8;
                  iVar4 = local_e34 + 1;
                }
                iVar4 = local_e30 + 1;
              }
            }
            break;
          case (MFIter *)0x1:
            for (local_e64 = 0; iVar4 = local_e00, local_e64 < local_11b8; local_e64 = local_e64 + 1
                ) {
              while (local_e68 = iVar4, iVar4 = iStack_bb0, local_e68 <= (int)uStack_1554) {
                while (local_e6c = iVar4, local_e6c <= iStack_1558) {
                  local_e74 = (int)local_1568 * (int)local_11e4;
                  local_a90 = local_e6c;
                  local_a94 = local_e68;
                  local_a98 = local_e64;
                  local_e80 = local_14f0.p +
                              (long)((int)local_1568 - local_14f0.begin.x) +
                              (local_e6c - local_14f0.begin.y) * local_14f0.jstride +
                              (local_e68 - local_14f0.begin.z) * local_14f0.kstride +
                              local_e64 * local_14f0.nstride;
                  for (local_e84 = 0; local_e84 < local_11dc; local_e84 = local_e84 + 1) {
                    local_e88 = local_e68 * local_11dc + local_e84;
                    for (local_e8c = 0; local_e8c < local_11e4._4_4_; local_e8c = local_e8c + 1) {
                      local_e90 = local_e6c * local_11e4._4_4_ + local_e8c;
                      local_890 = local_e64;
                      local_e98 = local_14f8 *
                                  local_1540.p
                                  [(long)(local_e74 - local_1540.begin.x) +
                                   (local_e90 - local_1540.begin.y) * local_1540.jstride +
                                   (local_e88 - local_1540.begin.z) * local_1540.kstride +
                                   local_e64 * local_1540.nstride];
                      *local_e80 = local_e98 + *local_e80;
                      local_88c = local_e88;
                      local_888 = local_e90;
                      local_884 = local_e74;
                      local_880 = local_dd0;
                      local_400 = local_e98;
                      local_3f8 = local_e80;
                    }
                  }
                  local_e70 = local_bb4;
                  local_a8c = local_bb4;
                  local_a88 = local_dc8;
                  iVar4 = local_e6c + 1;
                }
                iVar4 = local_e68 + 1;
              }
            }
            break;
          case (MFIter *)0x2:
            for (local_e9c = 0; iVar4 = local_e00, local_e9c < local_11b8; local_e9c = local_e9c + 1
                ) {
              while (local_ea0 = iVar4, iVar4 = local_bb4, local_ea0 <= (int)uStack_1554) {
                while (local_ea4 = iVar4, local_ea4 <= local_155c) {
                  local_eac = (local_1568._4_4_ + 1) * local_11e4._4_4_;
                  local_a74 = local_ea4;
                  local_a7c = local_ea0;
                  local_a80 = local_e9c;
                  local_eb8 = local_14f0.p +
                              (long)(local_ea4 - local_14f0.begin.x) +
                              (local_1568._4_4_ - local_14f0.begin.y) * local_14f0.jstride +
                              (local_ea0 - local_14f0.begin.z) * local_14f0.kstride +
                              local_e9c * local_14f0.nstride;
                  for (local_ebc = 0; local_ebc < local_11dc; local_ebc = local_ebc + 1) {
                    local_ec0 = local_ea0 * local_11dc + local_ebc;
                    for (local_ec4 = 0; local_ec4 < (int)local_11e4; local_ec4 = local_ec4 + 1) {
                      local_ec8 = local_ea4 * (int)local_11e4 + local_ec4;
                      local_878 = local_e9c;
                      local_ed0 = -local_14f8 *
                                  local_1540.p
                                  [(long)(local_ec8 - local_1540.begin.x) +
                                   (local_eac - local_1540.begin.y) * local_1540.jstride +
                                   (local_ec0 - local_1540.begin.z) * local_1540.kstride +
                                   local_e9c * local_1540.nstride];
                      *local_eb8 = local_ed0 + *local_eb8;
                      local_874 = local_ec0;
                      local_870 = local_eac;
                      local_86c = local_ec8;
                      local_868 = local_dd0;
                      local_3f0 = local_ed0;
                      local_3e8 = local_eb8;
                    }
                  }
                  local_ea8 = iStack_bb0;
                  local_a78 = iStack_bb0;
                  local_a70 = local_dc8;
                  iVar4 = local_ea4 + 1;
                }
                iVar4 = local_ea0 + 1;
              }
            }
            break;
          case (MFIter *)0x3:
            for (local_ed4 = 0; iVar4 = local_e00, local_ed4 < local_11b8; local_ed4 = local_ed4 + 1
                ) {
              while (local_ed8 = iVar4, iVar4 = local_bb4, local_ed8 <= (int)uStack_1554) {
                while (local_edc = iVar4, local_edc <= local_155c) {
                  local_ee4 = local_1568._4_4_ * local_11e4._4_4_;
                  local_a5c = local_edc;
                  local_a64 = local_ed8;
                  local_a68 = local_ed4;
                  local_ef0 = local_14f0.p +
                              (long)(local_edc - local_14f0.begin.x) +
                              (local_1568._4_4_ - local_14f0.begin.y) * local_14f0.jstride +
                              (local_ed8 - local_14f0.begin.z) * local_14f0.kstride +
                              local_ed4 * local_14f0.nstride;
                  for (local_ef4 = 0; local_ef4 < local_11dc; local_ef4 = local_ef4 + 1) {
                    local_ef8 = local_ed8 * local_11dc + local_ef4;
                    for (local_efc = 0; local_efc < (int)local_11e4; local_efc = local_efc + 1) {
                      local_f00 = local_edc * (int)local_11e4 + local_efc;
                      local_860 = local_ed4;
                      local_f08 = local_14f8 *
                                  local_1540.p
                                  [(long)(local_f00 - local_1540.begin.x) +
                                   (local_ee4 - local_1540.begin.y) * local_1540.jstride +
                                   (local_ef8 - local_1540.begin.z) * local_1540.kstride +
                                   local_ed4 * local_1540.nstride];
                      *local_ef0 = local_f08 + *local_ef0;
                      local_85c = local_ef8;
                      local_858 = local_ee4;
                      local_854 = local_f00;
                      local_850 = local_dd0;
                      local_3e0 = local_f08;
                      local_3d8 = local_ef0;
                    }
                  }
                  local_ee0 = iStack_bb0;
                  local_a60 = iStack_bb0;
                  local_a58 = local_dc8;
                  iVar4 = local_edc + 1;
                }
                iVar4 = local_ed8 + 1;
              }
            }
            break;
          case (MFIter *)0x4:
            for (local_f0c = 0; iVar4 = iStack_bb0, local_f0c < local_11b8;
                local_f0c = local_f0c + 1) {
              while (local_f10 = iVar4, iVar4 = local_bb4, local_f10 <= iStack_1558) {
                while (local_f14 = iVar4, local_f14 <= local_155c) {
                  local_f1c = (iStack_1560 + 1) * local_11dc;
                  local_a44 = local_f14;
                  local_a48 = local_f10;
                  local_a50 = local_f0c;
                  local_f28 = local_14f0.p +
                              (long)(local_f14 - local_14f0.begin.x) +
                              (local_f10 - local_14f0.begin.y) * local_14f0.jstride +
                              (iStack_1560 - local_14f0.begin.z) * local_14f0.kstride +
                              local_f0c * local_14f0.nstride;
                  for (local_f2c = 0; local_f2c < local_11e4._4_4_; local_f2c = local_f2c + 1) {
                    local_f30 = local_f10 * local_11e4._4_4_ + local_f2c;
                    for (local_f34 = 0; local_f34 < (int)local_11e4; local_f34 = local_f34 + 1) {
                      local_f38 = local_f14 * (int)local_11e4 + local_f34;
                      local_848 = local_f0c;
                      local_f40 = -local_14f8 *
                                  local_1540.p
                                  [(long)(local_f38 - local_1540.begin.x) +
                                   (local_f30 - local_1540.begin.y) * local_1540.jstride +
                                   (local_f1c - local_1540.begin.z) * local_1540.kstride +
                                   local_f0c * local_1540.nstride];
                      *local_f28 = local_f40 + *local_f28;
                      local_844 = local_f1c;
                      local_840 = local_f30;
                      local_83c = local_f38;
                      local_838 = local_dd0;
                      local_3d0 = local_f40;
                      local_3c8 = local_f28;
                    }
                  }
                  local_f18 = local_e00;
                  local_a4c = local_e00;
                  local_a40 = local_dc8;
                  iVar4 = local_f14 + 1;
                }
                iVar4 = local_f10 + 1;
              }
            }
            break;
          default:
            for (local_f44 = 0; iVar4 = iStack_bb0, local_f44 < local_11b8;
                local_f44 = local_f44 + 1) {
              while (local_f48 = iVar4, iVar4 = local_bb4, local_f48 <= iStack_1558) {
                while (local_f4c = iVar4, local_f4c <= local_155c) {
                  local_f54 = iStack_1560 * local_11dc;
                  local_abc = local_f4c;
                  local_ac0 = local_f48;
                  local_ac8 = local_f44;
                  local_f60 = local_14f0.p +
                              (long)(local_f4c - local_14f0.begin.x) +
                              (local_f48 - local_14f0.begin.y) * local_14f0.jstride +
                              (iStack_1560 - local_14f0.begin.z) * local_14f0.kstride +
                              local_f44 * local_14f0.nstride;
                  for (local_f64 = 0; local_f64 < local_11e4._4_4_; local_f64 = local_f64 + 1) {
                    local_f68 = local_f48 * local_11e4._4_4_ + local_f64;
                    for (local_f6c = 0; local_f6c < (int)local_11e4; local_f6c = local_f6c + 1) {
                      local_f70 = local_f4c * (int)local_11e4 + local_f6c;
                      local_8c0 = local_f44;
                      local_f78 = local_14f8 *
                                  local_1540.p
                                  [(long)(local_f70 - local_1540.begin.x) +
                                   (local_f68 - local_1540.begin.y) * local_1540.jstride +
                                   (local_f54 - local_1540.begin.z) * local_1540.kstride +
                                   local_f44 * local_1540.nstride];
                      *local_f60 = local_f78 + *local_f60;
                      local_8bc = local_f54;
                      local_8b8 = local_f68;
                      local_8b4 = local_f70;
                      local_8b0 = local_dd0;
                      local_420 = local_f78;
                      local_418 = local_f60;
                    }
                  }
                  local_f50 = local_e00;
                  local_ac4 = local_e00;
                  local_ab8 = local_dc8;
                  iVar4 = local_f4c + 1;
                }
                iVar4 = local_f48 + 1;
              }
            }
          }
        }
        local_1568 = uVar2;
        __gnu_cxx::
        __normal_iterator<amrex::FArrayBox_**,_std::vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>
        ::operator++(&local_1398);
      }
    }
    std::array<amrex::FArrayBox,_3UL>::~array(in_stack_ffffffffffffe970);
  }
  return;
}

Assistant:

void
YAFluxRegister::FineAdd (const MFIter& mfi,
                         const std::array<FArrayBox const*, AMREX_SPACEDIM>& a_flux,
                         const Real* dx, Real dt, RunOn runon) noexcept
{
    BL_ASSERT(m_cfpatch.nComp() == a_flux[0]->nComp());

    const int li = mfi.LocalIndex();
    Vector<FArrayBox*>& cfp_fabs = m_cfp_fab[li];
    if (cfp_fabs.empty()) return;

    const Box& tbx = mfi.tilebox();
    const Box& bx = amrex::coarsen(tbx, m_ratio);
    const Box& fbx = amrex::refine(bx, m_ratio);
    const int nc = m_cfpatch.nComp();

    const Real ratio = static_cast<Real>(AMREX_D_TERM(m_ratio[0],*m_ratio[1],*m_ratio[2]));
    std::array<Real,AMREX_SPACEDIM> dtdx{{AMREX_D_DECL(dt/(dx[0]*ratio),
                                                       dt/(dx[1]*ratio),
                                                       dt/(dx[2]*ratio))}};
    const Dim3 rr = m_ratio.dim3();

    std::array<FArrayBox const*,AMREX_SPACEDIM> flux{{AMREX_D_DECL(a_flux[0],a_flux[1],a_flux[2])}};
    bool use_gpu = (runon == RunOn::Gpu) && Gpu::inLaunchRegion();
    amrex::ignore_unused(use_gpu);
    std::array<FArrayBox,AMREX_SPACEDIM> ftmp;
    if (fbx != tbx) {
        AMREX_ASSERT(!use_gpu);
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            const Box& b = amrex::surroundingNodes(fbx,idim);
            ftmp[idim].resize(b,nc);
            ftmp[idim].setVal<RunOn::Host>(0.0);
            ftmp[idim].copy<RunOn::Host>(*a_flux[idim]);
            flux[idim] = &ftmp[idim];
        }
    }

    AMREX_ASSERT(bx.cellCentered());

    for (int idim=0; idim < AMREX_SPACEDIM; ++idim)
    {
        const Box& lobx = amrex::adjCellLo(bx, idim);
        const Box& hibx = amrex::adjCellHi(bx, idim);
        FArrayBox const* f = flux[idim];
        for (FArrayBox* cfp : cfp_fabs)
        {
            {
                const Box& lobx_is = lobx & cfp->box();
                const int side = 0;
                if (lobx_is.ok())
                {
                    auto d = cfp->array();
                    Real dtdxs = dtdx[idim];
                    int dirside = idim*2+side;
                    Array4<Real const> farr = f->const_array();
                    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_FLAG(runon, lobx_is, tmpbox,
                    {
                        yafluxreg_fineadd(tmpbox, d, farr, dtdxs, nc, dirside, rr);
                    });
                }
            }
            {
                const Box& hibx_is = hibx & cfp->box();
                const int side = 1;
                if (hibx_is.ok())
                {
                    auto d = cfp->array();
                    Real dtdxs = dtdx[idim];
                    int dirside = idim*2+side;
                    Array4<Real const> farr = f->const_array();
                    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_FLAG(runon, hibx_is, tmpbox,
                    {
                        yafluxreg_fineadd(tmpbox, d, farr, dtdxs, nc, dirside, rr);
                    });
                }
            }
        }
    }
}